

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomModel.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::CustomModel_CustomModelParamValue::CustomModel_CustomModelParamValue
          (CustomModel_CustomModelParamValue *this,CustomModel_CustomModelParamValue *from)

{
  uint32 uVar1;
  void *pvVar2;
  
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__CustomModel_CustomModelParamValue_00770480;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  this->_oneof_case_[0] = 0;
  uVar1 = from->_oneof_case_[0];
  if (uVar1 == 10) {
    set_doublevalue(this,(from->value_).doublevalue_);
  }
  else if (uVar1 == 0x14) {
    set_stringvalue(this,(string *)from->value_);
  }
  else if (uVar1 == 0x1e) {
    set_intvalue(this,(from->value_).intvalue_);
  }
  else if (uVar1 == 0x28) {
    set_longvalue(this,(from->value_).longvalue_);
  }
  else if (uVar1 == 0x32) {
    set_boolvalue(this,(bool)((from->value_).boolvalue_ & 1));
  }
  else if (uVar1 == 0x3c) {
    set_bytesvalue(this,(string *)from->value_);
  }
  return;
}

Assistant:

CustomModel_CustomModelParamValue::CustomModel_CustomModelParamValue(const CustomModel_CustomModelParamValue& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  clear_has_value();
  switch (from.value_case()) {
    case kDoubleValue: {
      set_doublevalue(from.doublevalue());
      break;
    }
    case kStringValue: {
      set_stringvalue(from.stringvalue());
      break;
    }
    case kIntValue: {
      set_intvalue(from.intvalue());
      break;
    }
    case kLongValue: {
      set_longvalue(from.longvalue());
      break;
    }
    case kBoolValue: {
      set_boolvalue(from.boolvalue());
      break;
    }
    case kBytesValue: {
      set_bytesvalue(from.bytesvalue());
      break;
    }
    case VALUE_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.CustomModel.CustomModelParamValue)
}